

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_etc.cpp
# Opt level: O1

bool crnlib::etc1_block::unpack_color5
               (color_quad_u8 *result,uint16 packed_color5,uint16 packed_delta3,bool scaled,
               uint alpha)

{
  uint uVar1;
  ushort uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  ushort uVar6;
  ushort uVar7;
  ushort uVar8;
  uint uVar9;
  ushort uVar10;
  uint uVar11;
  
  uVar7 = packed_delta3 >> 6 & 7;
  uVar10 = packed_delta3 >> 3 & 7;
  uVar2 = 0;
  if (3 < uVar7) {
    uVar2 = 0xfff8;
  }
  uVar8 = 0;
  if (3 < uVar10) {
    uVar8 = 0xfff8;
  }
  uVar6 = 0xfff8;
  if ((packed_delta3 & 7) < 4) {
    uVar6 = 0;
  }
  uVar5 = (int)(short)(uVar6 | packed_delta3 & 7) + (packed_color5 & 0x1f);
  uVar9 = (int)(short)(uVar8 | uVar10) + (packed_color5 >> 5 & 0x1f);
  uVar11 = (int)(short)(uVar2 | uVar7) + (packed_color5 >> 10 & 0x1f);
  uVar3 = uVar9 | uVar5 | uVar11;
  if (0x1f < uVar3) {
    if (0x1e < (int)uVar11) {
      uVar11 = 0x1f;
    }
    if ((int)uVar11 < 1) {
      uVar11 = 0;
    }
    if (0x1e < (int)uVar9) {
      uVar9 = 0x1f;
    }
    if ((int)uVar9 < 1) {
      uVar9 = 0;
    }
    uVar1 = 0x1f;
    if ((int)uVar5 < 0x1f) {
      uVar1 = uVar5;
    }
    uVar5 = uVar1;
    if ((int)uVar5 < 1) {
      uVar5 = 0;
    }
  }
  if (scaled) {
    uVar5 = (int)uVar5 >> 2 | uVar5 * 8;
    uVar9 = (int)uVar9 >> 2 | uVar9 * 8;
    uVar11 = (int)uVar11 >> 2 | uVar11 * 8;
  }
  uVar4 = 0xff;
  if (alpha < 0xff) {
    uVar4 = alpha;
  }
  (result->field_0).field_0.r = (uchar)uVar11;
  (result->field_0).field_0.g = (uchar)uVar9;
  (result->field_0).field_0.b = (uchar)uVar5;
  (result->field_0).field_0.a = (uchar)uVar4;
  return uVar3 < 0x20;
}

Assistant:

color_quad_i16 etc1_block::unpack_delta3(uint16 packed_delta3)
    {
        int r = (packed_delta3 >> 6) & 7;
        int g = (packed_delta3 >> 3) & 7;
        int b = packed_delta3 & 7;
        if (r >= 4)
        {
            r -= 8;
        }
        if (g >= 4)
        {
            g -= 8;
        }
        if (b >= 4)
        {
            b -= 8;
        }
        return color_quad_i16(r, g, b, 0);
    }